

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::LoadHeapArgsCached
              (JavascriptFunction *funcCallee,uint32 actualsCount,uint32 formalsCount,Var *paramAddr
              ,Var frameObj,ScriptContext *scriptContext,bool nonSimpleParamList)

{
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  HeapArgumentsObject *argsObj;
  Var pvVar6;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  if (actualsCount == 0xffffffff || formalsCount == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1d26,"(actualsCount != (uint32)-1 && formalsCount != (uint32)-1)"
                                ,"Loading the arguments object in the global function?");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  argsObj = CreateHeapArguments(funcCallee,actualsCount,formalsCount,frameObj,scriptContext);
  pvVar6 = FillScopeObject(funcCallee,actualsCount,formalsCount,frameObj,paramAddr,
                           (PropertyIdArray *)0x0,argsObj,scriptContext,nonSimpleParamList,true);
  pTVar2->noJsReentrancy = bVar1;
  return pvVar6;
}

Assistant:

Var JavascriptOperators::LoadHeapArgsCached(JavascriptFunction *funcCallee, uint32 actualsCount, uint32 formalsCount, Var *paramAddr, Var frameObj, ScriptContext* scriptContext, bool nonSimpleParamList)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_LoadHeapArgsCached, reentrancylock, scriptContext->GetThreadContext());
        // Disregard the "this" param.
        AssertMsg(actualsCount != (uint32)-1 && formalsCount != (uint32)-1,
                  "Loading the arguments object in the global function?");

        HeapArgumentsObject *argsObj = JavascriptOperators::CreateHeapArguments(funcCallee, actualsCount, formalsCount, frameObj, scriptContext);

        return FillScopeObject(funcCallee, actualsCount, formalsCount, frameObj, paramAddr, nullptr, argsObj, scriptContext, nonSimpleParamList, true);
        JIT_HELPER_END(Op_LoadHeapArgsCached);
    }